

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  int iVar1;
  int iVar2;
  DateTime *p_00;
  uchar *puVar3;
  sqlite3_context *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  double r;
  int eType;
  uchar *z;
  int n;
  int i;
  int in_stack_00000044;
  char *in_stack_00000048;
  sqlite3_context *in_stack_00000050;
  sqlite3_context *in_stack_ffffffffffffffb8;
  sqlite3_context *psVar4;
  int iVar5;
  undefined4 uVar6;
  int local_4;
  
  uVar6 = 0xaaaaaaaa;
  iVar5 = -0x55555556;
  psVar4 = (sqlite3_context *)&DAT_aaaaaaaaaaaaaaaa;
  memset(in_RCX,0,0x30);
  if (in_ESI == 0) {
    iVar5 = sqlite3NotPureFunc(psVar4);
    if (iVar5 == 0) {
      local_4 = 1;
    }
    else {
      local_4 = setDateTimeToCurrent(in_stack_ffffffffffffffb8,(DateTime *)0x22c881);
    }
  }
  else {
    iVar1 = sqlite3_value_type((sqlite3_value *)*in_RDX);
    if ((iVar1 == 2) || (iVar1 == 1)) {
      psVar4 = in_RCX;
      r = sqlite3_value_double((sqlite3_value *)0x22c8bd);
      setRawDateNumber((DateTime *)in_RCX,r);
      in_RCX = psVar4;
    }
    else {
      p_00 = (DateTime *)sqlite3_value_text((sqlite3_value *)0x22c8d5);
      if ((p_00 == (DateTime *)0x0) ||
         (iVar1 = parseDateOrTime(in_RCX,(char *)CONCAT44(uVar6,iVar5),p_00), iVar1 != 0)) {
        return 1;
      }
    }
    for (iVar1 = 1; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      puVar3 = sqlite3_value_text((sqlite3_value *)0x22c92f);
      iVar5 = sqlite3_value_bytes((sqlite3_value *)0x22c947);
      if ((puVar3 == (uchar *)0x0) ||
         (iVar2 = parseModifier(in_stack_00000050,in_stack_00000048,in_stack_00000044,
                                (DateTime *)context,argc), iVar2 != 0)) {
        return 1;
      }
    }
    computeJD((DateTime *)CONCAT44(iVar1,iVar5));
    if ((((byte)in_RCX->field_0x2c >> 1 & 1) == 0) &&
       (iVar5 = validJulianDay((sqlite3_int64)in_RCX->pOut), iVar5 != 0)) {
      if (((in_ESI == 1) && (in_RCX->skipFlag != '\0')) && (0x1c < *(int *)&in_RCX->pMem)) {
        in_RCX->skipFlag = '\0';
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int isDate(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv,
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    if( !sqlite3NotPureFunc(context) ) return 1;
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p, i) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  if( argc==1 && p->validYMD && p->D>28 ){
    /* Make sure a YYYY-MM-DD is normalized.
    ** Example: 2023-02-31 -> 2023-03-03 */
    assert( p->validJD );
    p->validYMD = 0;
  }
  return 0;
}